

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcComms.cpp
# Opt level: O3

void __thiscall helics::ipc::IpcComms::queue_tx_function(IpcComms *this)

{
  _Rb_tree_color _Var1;
  ulong uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  int iVar8;
  int *piVar9;
  _Base_ptr p_Var10;
  uint priority;
  int iVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  SendToQueue *pSVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  pair<std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::_Rb_tree_iterator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  pVar15;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  ActionMessage err;
  SendToQueue rxQueue;
  map<helics::route_id,_helics::ipc::SendToQueue,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  routes;
  SendToQueue brokerQueue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_328;
  size_type sStack_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_type local_300;
  undefined1 local_2f8 [8];
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 local_2e0 [16];
  Time local_2d0;
  Time local_2c8;
  undefined1 local_2c0;
  undefined7 uStack_2bf;
  undefined1 local_2b8 [16];
  byte local_2a8 [24];
  void *local_290;
  byte bStack_288;
  byte local_287 [31];
  byte *local_268;
  BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
  *local_238;
  SendToQueue local_230;
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  local_1a8;
  undefined1 local_178 [32];
  Time TStack_158;
  Time local_150;
  Time TStack_148;
  Time local_140;
  byte abStack_138 [64];
  size_t sStack_f8;
  size_t local_f0;
  byte *local_e8;
  undefined8 local_e0;
  pointer pbStack_d8;
  pointer local_d0;
  pointer pbStack_c8;
  SendToQueue local_b8;
  
  local_b8.connectionNameOrig._M_dataplus._M_p = (pointer)&local_b8.connectionNameOrig.field_2;
  local_b8.txqueue._M_t.
  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )0x0;
  local_b8.connectionNameOrig._M_string_length = 0;
  local_b8.connectionNameOrig.field_2._M_local_buf[0] = '\0';
  local_b8.connectionName._M_dataplus._M_p = (pointer)&local_b8.connectionName.field_2;
  local_b8.connectionName._M_string_length = 0;
  local_b8.connectionName.field_2._M_local_buf[0] = '\0';
  local_b8.errorString._M_dataplus._M_p = (pointer)&local_b8.errorString.field_2;
  local_b8.errorString._M_string_length = 0;
  local_b8.errorString.field_2._M_local_buf[0] = '\0';
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_b8.connected = false;
  local_230.connectionNameOrig._M_dataplus._M_p = (pointer)&local_230.connectionNameOrig.field_2;
  local_230.txqueue._M_t.
  super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  .
  super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>,_true,_true>
        )(__uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
          )0x0;
  local_230.connectionNameOrig._M_string_length = 0;
  local_230.connectionNameOrig.field_2._M_local_buf[0] = '\0';
  local_230.connectionName._M_dataplus._M_p = (pointer)&local_230.connectionName.field_2;
  local_230.connectionName._M_string_length = 0;
  local_230.connectionName.field_2._M_local_buf[0] = '\0';
  local_230.errorString._M_dataplus._M_p = (pointer)&local_230.errorString.field_2;
  local_230.errorString._M_string_length = 0;
  local_230.errorString.field_2._M_local_buf[0] = '\0';
  local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._1_7_ = 0;
  local_230.connected = false;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a8._M_impl.super__Rb_tree_header._M_header;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_300 = (this->super_CommsInterface).brokerTargetAddress._M_string_length;
  local_1a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_300 == 0) {
LAB_0025c66e:
    bVar7 = gmlc::concurrency::TriggerVariable::wait_forActivation
                      (&(this->super_CommsInterface).rxTrigger,
                       &(this->super_CommsInterface).connectionTimeout);
    if (bVar7) {
      if ((this->super_CommsInterface).rxStatus._M_i == ERRORED) {
        CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
        goto LAB_0025cdc8;
      }
      iVar11 = (int)this + 0xf0;
      iVar8 = SendToQueue::connect(&local_230,iVar11,(sockaddr *)0x0,0);
      if ((char)iVar8 == '\0') {
        LOCK();
        (this->ipcbackchannel).super___atomic_base<int>._M_i = 2;
        UNLOCK();
        if ((this->ipcbackchannel).super___atomic_base<int>._M_i != 0) {
          do {
            if ((this->super_CommsInterface).rxStatus._M_i != CONNECTED) break;
            local_2f8 = (undefined1  [8])0x0;
            local_2f0 = (undefined1 *)0x5f5e100;
            do {
              iVar8 = nanosleep((timespec *)local_2f8,(timespec *)local_2f8);
              if (iVar8 != -1) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
          } while ((this->ipcbackchannel).super___atomic_base<int>._M_i != 0);
        }
        if (((this->super_CommsInterface).rxStatus._M_i != CONNECTED) ||
           (iVar8 = SendToQueue::connect(&local_230,iVar11,(sockaddr *)0x0,0), (char)iVar8 == '\0'))
        {
          ActionMessage::ActionMessage((ActionMessage *)local_2f8,cmd_error);
          local_2f8._4_4_ = 0xfffffffe;
          local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230.errorString._M_dataplus._M_p;
          sStack_320 = local_230.errorString._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x28;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_328;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_178,(v11 *)"Unable to open receiver connection -> {}",fmt_00,
                     args_00);
          uVar5 = local_178._8_8_;
          uVar4 = local_178._0_8_;
          local_287[0xf] = (byte)local_178._8_8_;
          local_287._16_7_ = SUB87(local_178._8_8_,1);
          if (((byte *)local_178._0_8_ != local_268) &&
             (SmallBuffer::reserve((SmallBuffer *)local_2b8,local_178._8_8_), uVar5 != 0)) {
            memcpy(local_268,(void *)uVar4,uVar5);
          }
          if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
            operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
          }
          if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
              (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->super_CommsInterface).ActionCallback._M_invoker)
                    ((_Any_data *)&(this->super_CommsInterface).ActionCallback,
                     (ActionMessage *)local_2f8);
          CommsInterface::setRxStatus(&this->super_CommsInterface,ERRORED);
          goto LAB_0025cdbe;
        }
      }
      CommsInterface::setTxStatus(&this->super_CommsInterface,CONNECTED);
      local_238 = &(this->super_CommsInterface).txQueue;
LAB_0025c757:
      local_178._0_8_ = (byte *)0x0;
      local_178._8_8_ = 0x9aac0f0000000000;
      local_178._16_8_ = 0x9aac0f0000000000;
      abStack_138[0x38] = 0;
      abStack_138[0x39] = 0;
      abStack_138[0x3a] = 0;
      abStack_138[0x3b] = 0;
      abStack_138[0x3c] = 0;
      abStack_138[0x3d] = 0;
      abStack_138[0x3e] = 0;
      abStack_138[0x3f] = 0;
      sStack_f8 = 0;
      abStack_138[0x28] = 0;
      abStack_138[0x29] = 0;
      abStack_138[0x2a] = 0;
      abStack_138[0x2b] = 0;
      abStack_138[0x2c] = 0;
      abStack_138[0x2d] = 0;
      abStack_138[0x2e] = 0;
      abStack_138[0x2f] = 0;
      abStack_138[0x30] = 0;
      abStack_138[0x31] = 0;
      abStack_138[0x32] = 0;
      abStack_138[0x33] = 0;
      abStack_138[0x34] = 0;
      abStack_138[0x35] = 0;
      abStack_138[0x36] = 0;
      abStack_138[0x37] = 0;
      abStack_138[0x18] = 0;
      abStack_138[0x19] = 0;
      abStack_138[0x1a] = 0;
      abStack_138[0x1b] = 0;
      abStack_138[0x1c] = 0;
      abStack_138[0x1d] = 0;
      abStack_138[0x1e] = 0;
      abStack_138[0x1f] = 0;
      abStack_138[0x20] = 0;
      abStack_138[0x21] = 0;
      abStack_138[0x22] = 0;
      abStack_138[0x23] = 0;
      abStack_138[0x24] = 0;
      abStack_138[0x25] = 0;
      abStack_138[0x26] = 0;
      abStack_138[0x27] = 0;
      abStack_138[8] = 0;
      abStack_138[9] = 0;
      abStack_138[10] = 0;
      abStack_138[0xb] = 0;
      abStack_138[0xc] = 0;
      abStack_138[0xd] = 0;
      abStack_138[0xe] = 0;
      abStack_138[0xf] = 0;
      abStack_138[0x10] = 0;
      abStack_138[0x11] = 0;
      abStack_138[0x12] = 0;
      abStack_138[0x13] = 0;
      abStack_138[0x14] = 0;
      abStack_138[0x15] = 0;
      abStack_138[0x16] = 0;
      abStack_138[0x17] = 0;
      local_140.internalTimeCode = 0;
      abStack_138[0] = 0;
      abStack_138[1] = 0;
      abStack_138[2] = 0;
      abStack_138[3] = 0;
      abStack_138[4] = 0;
      abStack_138[5] = 0;
      abStack_138[6] = 0;
      abStack_138[7] = 0;
      local_150.internalTimeCode = 0;
      TStack_148.internalTimeCode = 0;
      local_178._24_2_ = 0;
      local_178._26_2_ = 0;
      local_178._28_4_ = 0;
      TStack_158.internalTimeCode = 0;
      local_f0 = 0x40;
      local_e8 = abStack_138;
      local_d0 = (pointer)0x0;
      pbStack_c8 = (pointer)0x0;
      local_e0._0_1_ = false;
      local_e0._1_1_ = false;
      local_e0._2_1_ = false;
      local_e0._3_1_ = '\0';
      local_e0._4_4_ = 0;
      pbStack_d8 = (pointer)0x0;
      gmlc::containers::
      BlockingPriorityQueue<std::pair<helics::route_id,_helics::ActionMessage>,_std::mutex,_std::condition_variable>
      ::pop((pair<helics::route_id,_helics::ActionMessage> *)local_2f8,local_238);
      uVar3 = local_2f8._0_4_;
      ActionMessage::operator=((ActionMessage *)local_178,(ActionMessage *)&local_2f0);
      ActionMessage::~ActionMessage((ActionMessage *)&local_2f0);
      if (~cmd_protocol_priority < (int)local_178._0_4_) {
        if ((local_178._0_4_ == cmd_protocol_big) || (local_178._0_4_ == cmd_protocol))
        goto LAB_0025c815;
LAB_0025c855:
        ActionMessage::to_string_abi_cxx11_((string *)local_2f8,(ActionMessage *)local_178);
        priority = (uint)local_178._0_4_ >> 0x1e | 1;
        pSVar14 = &local_230;
        if (uVar3 == cmd_broker_setup) {
LAB_0025c892:
          SendToQueue::sendMessage(pSVar14,(ActionMessage *)local_178,priority);
        }
        else if (uVar3 == cmd_ignore) {
          pSVar14 = &local_b8;
          if (local_300 != 0) goto LAB_0025c892;
        }
        else {
          if (local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_0025c8f4:
            pSVar14 = &local_b8;
            if (local_300 == 0) goto LAB_0025cac8;
          }
          else {
            p_Var13 = &local_1a8._M_impl.super__Rb_tree_header._M_header;
            p_Var6 = local_1a8._M_impl.super__Rb_tree_header._M_header._M_parent;
            do {
              p_Var10 = p_Var6;
              p_Var12 = p_Var13;
              _Var1 = p_Var10[1]._M_color;
              p_Var13 = p_Var10;
              if ((int)_Var1 < (int)uVar3) {
                p_Var13 = p_Var12;
              }
              p_Var6 = (&p_Var10->_M_left)[(int)_Var1 < (int)uVar3];
            } while ((&p_Var10->_M_left)[(int)_Var1 < (int)uVar3] != (_Base_ptr)0x0);
            if ((_Rb_tree_header *)p_Var13 == &local_1a8._M_impl.super__Rb_tree_header)
            goto LAB_0025c8f4;
            if ((int)_Var1 < (int)uVar3) {
              p_Var10 = p_Var12;
            }
            if ((int)uVar3 < (int)p_Var10[1]._M_color) goto LAB_0025c8f4;
            pSVar14 = (SendToQueue *)&p_Var13[1]._M_parent;
          }
          SendToQueue::sendMessage(pSVar14,(ActionMessage *)local_178,priority);
        }
LAB_0025cac8:
        if (local_2f8 != (undefined1  [8])&local_2e8) {
          operator_delete((void *)local_2f8,local_2e8 + 1);
        }
LAB_0025cae4:
        ActionMessage::~ActionMessage((ActionMessage *)local_178);
        goto LAB_0025c757;
      }
      if (local_178._0_4_ != cmd_protocol_priority) {
LAB_0025c81e:
        if (local_178._0_4_ == cmd_init_grant) {
          ActionMessage::ActionMessage((ActionMessage *)local_2f8,cmd_protocol);
          local_2f8._4_4_ = 0x20fc7;
          SendToQueue::sendMessage(&local_230,(ActionMessage *)local_2f8,3);
          ActionMessage::~ActionMessage((ActionMessage *)local_2f8);
        }
        goto LAB_0025c855;
      }
LAB_0025c815:
      if (uVar3 != cmd_broker_setup) goto LAB_0025c81e;
      if (local_178._4_4_ == 0xe9) {
        local_2f8 = (undefined1  [8])0x0;
        local_2f0 = local_2e0;
        local_2e8 = 0;
        local_2e0[0] = 0;
        local_2d0.internalTimeCode = (baseType)&local_2c0;
        local_2c8.internalTimeCode = 0;
        local_2c0 = 0;
        local_2b8._8_8_ = local_2a8 + 8;
        local_2a8[0] = 0;
        local_2a8[1] = 0;
        local_2a8[2] = 0;
        local_2a8[3] = 0;
        local_2a8[4] = 0;
        local_2a8[5] = 0;
        local_2a8[6] = 0;
        local_2a8[7] = 0;
        local_2a8[8] = 0;
        local_287[7] = 0;
        local_287[8] = 0;
        local_287[9] = 0;
        local_287[10] = 0;
        local_287[0xb] = 0;
        local_287[0xc] = 0;
        local_287[0xd] = 0;
        local_287[0xe] = 0;
        local_287[0xf] = 0;
        local_290 = (void *)0x0;
        bStack_288 = 0;
        local_287[0] = 0;
        local_287[1] = 0;
        local_287[2] = 0;
        local_287[3] = 0;
        local_287[4] = 0;
        local_287[5] = 0;
        local_287[6] = 0;
        local_328 = &local_318;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_328,local_e8,local_e8 + sStack_f8);
        iVar8 = SendToQueue::connect
                          ((SendToQueue *)local_2f8,(int)(string *)&local_328,(sockaddr *)0x0,3);
        if (local_328 != &local_318) {
          operator_delete(local_328,local_318._M_allocated_capacity + 1);
        }
        if ((char)iVar8 != '\0') {
          local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_328._4_4_,local_178._20_4_);
          std::
          _Rb_tree<helics::route_id,std::pair<helics::route_id_const,helics::ipc::SendToQueue>,std::_Select1st<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>>
          ::_M_emplace_unique<helics::route_id,helics::ipc::SendToQueue>
                    ((_Rb_tree<helics::route_id,std::pair<helics::route_id_const,helics::ipc::SendToQueue>,std::_Select1st<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>,std::less<helics::route_id>,std::allocator<std::pair<helics::route_id_const,helics::ipc::SendToQueue>>>
                      *)&local_1a8,(route_id *)&local_328,(SendToQueue *)local_2f8);
        }
        if (local_290 != (void *)0x0) {
          operator_delete(local_290,CONCAT71(local_287._8_7_,local_287[7]) - (long)local_290);
        }
        if ((byte *)local_2b8._8_8_ != local_2a8 + 8) {
          operator_delete((void *)local_2b8._8_8_,CONCAT71(local_2a8._9_7_,local_2a8[8]) + 1);
        }
        if ((undefined1 *)local_2d0.internalTimeCode != &local_2c0) {
          operator_delete((void *)local_2d0.internalTimeCode,CONCAT71(uStack_2bf,local_2c0) + 1);
        }
        if (local_2f0 != local_2e0) {
          operator_delete(local_2f0,CONCAT71(local_2e0._1_7_,local_2e0[0]) + 1);
        }
        std::
        unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
        ::~unique_ptr((unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
                       *)local_2f8);
        goto LAB_0025cae4;
      }
      if (local_178._4_4_ == 0xf4) {
        local_2f8._0_4_ = local_178._20_4_;
        pVar15 = std::
                 _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
                 ::equal_range(&local_1a8,(key_type *)local_2f8);
        std::
        _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
        ::_M_erase_aux(&local_1a8,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node);
        goto LAB_0025cae4;
      }
      if (local_178._4_4_ != 0x9db) goto LAB_0025c81e;
      ActionMessage::~ActionMessage((ActionMessage *)local_178);
      CommsInterface::setTxStatus(&this->super_CommsInterface,TERMINATED);
      goto LAB_0025cdc8;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_2f8,cmd_error);
    local_2f8._4_4_ = 0xfffffffe;
    SmallBuffer::operator=((SmallBuffer *)local_2b8,(char (*) [29])"Unable to link with receiver");
    if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_CommsInterface).ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_CommsInterface).ActionCallback,(ActionMessage *)local_2f8)
    ;
    CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
  }
  else {
    iVar11 = (int)this + 0x110;
    iVar8 = SendToQueue::connect(&local_b8,iVar11,(sockaddr *)0x1,0x14);
    if ((char)iVar8 != '\0') goto LAB_0025c66e;
    uVar2 = (this->super_CommsInterface).connectionTimeout.__r;
    if (0 < (long)uVar2) {
      local_2f8 = (undefined1  [8])(uVar2 / 1000);
      local_2f0 = (undefined1 *)((uVar2 % 1000) * 1000000);
      do {
        iVar8 = nanosleep((timespec *)local_2f8,(timespec *)local_2f8);
        if (iVar8 != -1) break;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
    }
    iVar8 = SendToQueue::connect(&local_b8,iVar11,(sockaddr *)0x1,0x14);
    if ((char)iVar8 != '\0') goto LAB_0025c66e;
    ActionMessage::ActionMessage((ActionMessage *)local_2f8,cmd_error);
    local_328 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8.errorString._M_dataplus._M_p;
    sStack_320 = local_b8.errorString._M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x26;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_328;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_178,(v11 *)"Unable to open broker connection -> {}",fmt,args);
    uVar5 = local_178._8_8_;
    uVar4 = local_178._0_8_;
    local_287[0xf] = (byte)local_178._8_8_;
    local_287._16_7_ = SUB87(local_178._8_8_,1);
    if (((byte *)local_178._0_8_ != local_268) &&
       (SmallBuffer::reserve((SmallBuffer *)local_2b8,local_178._8_8_), uVar5 != 0)) {
      memcpy(local_268,(void *)uVar4,uVar5);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    local_2f8._4_4_ = 0xfffffffe;
    if ((this->super_CommsInterface).ActionCallback.super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_CommsInterface).ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_CommsInterface).ActionCallback,(ActionMessage *)local_2f8)
    ;
    CommsInterface::setTxStatus(&this->super_CommsInterface,ERRORED);
  }
LAB_0025cdbe:
  ActionMessage::~ActionMessage((ActionMessage *)local_2f8);
LAB_0025cdc8:
  std::
  _Rb_tree<helics::route_id,_std::pair<const_helics::route_id,_helics::ipc::SendToQueue>,_std::_Select1st<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>,_std::less<helics::route_id>,_std::allocator<std::pair<const_helics::route_id,_helics::ipc::SendToQueue>_>_>
  ::~_Rb_tree(&local_1a8);
  if (local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_230.buffer.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_230.buffer.super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_230.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.errorString._M_dataplus._M_p != &local_230.errorString.field_2) {
    operator_delete(local_230.errorString._M_dataplus._M_p,
                    CONCAT71(local_230.errorString.field_2._M_allocated_capacity._1_7_,
                             local_230.errorString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.connectionName._M_dataplus._M_p != &local_230.connectionName.field_2) {
    operator_delete(local_230.connectionName._M_dataplus._M_p,
                    CONCAT71(local_230.connectionName.field_2._M_allocated_capacity._1_7_,
                             local_230.connectionName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230.connectionNameOrig._M_dataplus._M_p != &local_230.connectionNameOrig.field_2) {
    operator_delete(local_230.connectionNameOrig._M_dataplus._M_p,
                    CONCAT71(local_230.connectionNameOrig.field_2._M_allocated_capacity._1_7_,
                             local_230.connectionNameOrig.field_2._M_local_buf[0]) + 1);
  }
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&local_230.txqueue);
  if (local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_b8.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.errorString._M_dataplus._M_p != &local_b8.errorString.field_2) {
    operator_delete(local_b8.errorString._M_dataplus._M_p,
                    CONCAT71(local_b8.errorString.field_2._M_allocated_capacity._1_7_,
                             local_b8.errorString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.connectionName._M_dataplus._M_p != &local_b8.connectionName.field_2) {
    operator_delete(local_b8.connectionName._M_dataplus._M_p,
                    CONCAT71(local_b8.connectionName.field_2._M_allocated_capacity._1_7_,
                             local_b8.connectionName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.connectionNameOrig._M_dataplus._M_p != &local_b8.connectionNameOrig.field_2) {
    operator_delete(local_b8.connectionNameOrig._M_dataplus._M_p,
                    CONCAT71(local_b8.connectionNameOrig.field_2._M_allocated_capacity._1_7_,
                             local_b8.connectionNameOrig.field_2._M_local_buf[0]) + 1);
  }
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&local_b8.txqueue);
  return;
}

Assistant:

void IpcComms::queue_tx_function()
    {
        SendToQueue brokerQueue;  //!< the queue of the broker
        SendToQueue rxQueue;
        std::map<route_id, SendToQueue> routes;  //!< table of the routes to other brokers
        bool hasBroker = false;

        if (!brokerTargetAddress.empty()) {
            bool conn = brokerQueue.connect(brokerTargetAddress, true, 20);
            if (!conn) {
                std::this_thread::sleep_for(connectionTimeout);
                conn = brokerQueue.connect(brokerTargetAddress, true, 20);
                if (!conn) {
                    ActionMessage err(CMD_ERROR);
                    err.payload = fmt::format("Unable to open broker connection -> {}",
                                              brokerQueue.getError());
                    err.messageID = defs::Errors::CONNECTION_FAILURE;
                    ActionCallback(std::move(err));
                    setTxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            }
            hasBroker = true;
        }
        // wait for the receiver to STARTUP
        if (!rxTrigger.wait_forActivation(connectionTimeout)) {
            ActionMessage err(CMD_ERROR);
            err.messageID = defs::Errors::CONNECTION_FAILURE;
            err.payload = "Unable to link with receiver";
            ActionCallback(std::move(err));
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        if (getRxStatus() == ConnectionStatus::ERRORED) {
            setTxStatus(ConnectionStatus::ERRORED);
            return;
        }
        bool conn = rxQueue.connect(localTargetAddress, false, 0);
        if (!conn) {
            /** lets try a reset of the receiver*/
            ipcbackchannel = IPC_BACKCHANNEL_TRY_RESET;
            while (ipcbackchannel != 0) {
                if (getRxStatus() != ConnectionStatus::CONNECTED) {
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }
            if (getRxStatus() == ConnectionStatus::CONNECTED) {
                conn = rxQueue.connect(localTargetAddress, false, 0);
            }
            if (!conn) {
                ActionMessage err(CMD_ERROR);
                err.messageID = defs::Errors::CONNECTION_FAILURE;
                err.payload =
                    fmt::format("Unable to open receiver connection -> {}", rxQueue.getError());
                ActionCallback(std::move(err));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }

        setTxStatus(ConnectionStatus::CONNECTED);
        bool IPCoperating = false;
        bool continueLoop{true};
        while (continueLoop) {
            route_id rid;
            ActionMessage cmd;
            std::tie(rid, cmd) = txQueue.pop();
            if (isProtocolCommand(cmd)) {
                if (rid == control_route) {
                    switch (cmd.messageID) {
                        case NEW_ROUTE: {
                            SendToQueue newQueue;
                            bool newQconnected =
                                newQueue.connect(std::string(cmd.payload.to_string()), false, 3);
                            if (newQconnected) {
                                routes.emplace(route_id{cmd.getExtraData()}, std::move(newQueue));
                            }
                            continue;
                        }
                        case REMOVE_ROUTE:
                            routes.erase(route_id{cmd.getExtraData()});
                            continue;
                        case DISCONNECT:
                            continueLoop = false;
                            continue;
                    }
                }
            }
            if (cmd.action() == CMD_INIT_GRANT) {
                if (!IPCoperating) {
                    ActionMessage op(CMD_PROTOCOL);
                    op.messageID = SET_TO_OPERATING;
                    rxQueue.sendMessage(op, 3);
                }
            }
            std::string buffer = cmd.to_string();
            int priority = isPriorityCommand(cmd) ? 3 : 1;
            if (rid == parent_route_id) {
                if (hasBroker) {
                    brokerQueue.sendMessage(cmd, priority);
                }
            } else if (rid == control_route) {
                rxQueue.sendMessage(cmd, priority);
            } else {
                auto routeFnd = routes.find(rid);
                if (routeFnd != routes.end()) {
                    routeFnd->second.sendMessage(cmd, priority);
                } else {
                    if (hasBroker) {
                        brokerQueue.sendMessage(cmd, priority);
                    }
                }
            }
        }
        setTxStatus(ConnectionStatus::TERMINATED);
    }